

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jdicc.c
# Opt level: O0

boolean jpeg_read_icc_profile(j_decompress_ptr cinfo,JOCTET **icc_data_ptr,uint *icc_data_len)

{
  boolean bVar1;
  uint *in_RDX;
  undefined8 *in_RSI;
  long *in_RDI;
  uint length;
  JOCTET *dst_ptr;
  JOCTET *src_ptr;
  uint data_offset [256];
  uint data_length [256];
  char marker_present [256];
  uint total_length;
  JOCTET *icc_data;
  int seq_no;
  int num_markers;
  jpeg_saved_marker_ptr_conflict marker;
  int local_95c;
  JOCTET *local_958;
  JOCTET *local_950;
  uint auStack_948 [256];
  int aiStack_548 [256];
  char acStack_148 [268];
  uint local_3c;
  void *local_38;
  uint local_30;
  uint local_2c;
  jpeg_saved_marker_ptr_conflict local_28;
  uint *local_20;
  undefined8 *local_18;
  long *local_10;
  boolean local_4;
  
  local_2c = 0;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  if ((in_RSI == (undefined8 *)0x0) || (in_RDX == (uint *)0x0)) {
    *(undefined4 *)(*in_RDI + 0x28) = 0x17;
    (**(code **)*in_RDI)(in_RDI);
  }
  if (*(int *)((long)local_10 + 0x24) < 0xca) {
    *(undefined4 *)(*local_10 + 0x28) = 0x14;
    *(undefined4 *)(*local_10 + 0x2c) = *(undefined4 *)((long)local_10 + 0x24);
    (**(code **)*local_10)(local_10);
  }
  *local_18 = 0;
  *local_20 = 0;
  for (local_30 = 1; (int)local_30 < 0x100; local_30 = local_30 + 1) {
    acStack_148[(int)local_30] = '\0';
  }
  local_28 = (jpeg_saved_marker_ptr_conflict)local_10[0x32];
  do {
    if (local_28 == (jpeg_saved_marker_ptr_conflict)0x0) {
      if (local_2c == 0) {
        local_4 = 0;
      }
      else {
        local_3c = 0;
        for (local_30 = 1; (int)local_30 <= (int)local_2c; local_30 = local_30 + 1) {
          if (acStack_148[(int)local_30] == '\0') {
            *(undefined4 *)(*local_10 + 0x28) = 0x7f;
            (**(code **)(*local_10 + 8))(local_10,0xffffffff);
            return 0;
          }
          auStack_948[(int)local_30] = local_3c;
          local_3c = aiStack_548[(int)local_30] + local_3c;
        }
        if (local_3c == 0) {
          *(undefined4 *)(*local_10 + 0x28) = 0x7f;
          (**(code **)(*local_10 + 8))(local_10,0xffffffff);
          local_4 = 0;
        }
        else {
          local_38 = malloc((ulong)local_3c);
          if (local_38 == (void *)0x0) {
            *(undefined4 *)(*local_10 + 0x28) = 0x36;
            *(undefined4 *)(*local_10 + 0x2c) = 0xb;
            (**(code **)*local_10)(local_10);
          }
          for (local_28 = (jpeg_saved_marker_ptr_conflict)local_10[0x32];
              local_28 != (jpeg_saved_marker_ptr_conflict)0x0; local_28 = local_28->next) {
            bVar1 = marker_is_icc(local_28);
            if (bVar1 != 0) {
              local_30 = (uint)local_28->data[0xc];
              local_95c = aiStack_548[(int)local_30];
              local_958 = (JOCTET *)((long)local_38 + (ulong)auStack_948[(int)local_30]);
              local_950 = local_28->data + 0xe;
              while (local_95c != 0) {
                *local_958 = *local_950;
                local_95c = local_95c + -1;
                local_958 = local_958 + 1;
                local_950 = local_950 + 1;
              }
            }
          }
          *local_18 = local_38;
          *local_20 = local_3c;
          local_4 = 1;
        }
      }
      return local_4;
    }
    bVar1 = marker_is_icc(local_28);
    if (bVar1 != 0) {
      if (local_2c == 0) {
        local_2c = (uint)local_28->data[0xd];
      }
      else if (local_2c != local_28->data[0xd]) {
        *(undefined4 *)(*local_10 + 0x28) = 0x7f;
        (**(code **)(*local_10 + 8))(local_10,0xffffffff);
        return 0;
      }
      local_30 = (uint)local_28->data[0xc];
      if ((local_30 == 0) || ((int)local_2c < (int)local_30)) {
        *(undefined4 *)(*local_10 + 0x28) = 0x7f;
        (**(code **)(*local_10 + 8))(local_10,0xffffffff);
        return 0;
      }
      if (acStack_148[(int)local_30] != '\0') {
        *(undefined4 *)(*local_10 + 0x28) = 0x7f;
        (**(code **)(*local_10 + 8))(local_10,0xffffffff);
        return 0;
      }
      acStack_148[(int)local_30] = '\x01';
      aiStack_548[(int)local_30] = local_28->data_length - 0xe;
    }
    local_28 = local_28->next;
  } while( true );
}

Assistant:

GLOBAL(boolean)
jpeg_read_icc_profile(j_decompress_ptr cinfo, JOCTET **icc_data_ptr,
                      unsigned int *icc_data_len)
{
  jpeg_saved_marker_ptr marker;
  int num_markers = 0;
  int seq_no;
  JOCTET *icc_data;
  unsigned int total_length;
#define MAX_SEQ_NO  255         /* sufficient since marker numbers are bytes */
  char marker_present[MAX_SEQ_NO + 1];      /* 1 if marker found */
  unsigned int data_length[MAX_SEQ_NO + 1]; /* size of profile data in marker */
  unsigned int data_offset[MAX_SEQ_NO + 1]; /* offset for data in marker */

  if (icc_data_ptr == NULL || icc_data_len == NULL)
    ERREXIT(cinfo, JERR_BUFFER_SIZE);
  if (cinfo->global_state < DSTATE_READY)
    ERREXIT1(cinfo, JERR_BAD_STATE, cinfo->global_state);

  *icc_data_ptr = NULL;         /* avoid confusion if FALSE return */
  *icc_data_len = 0;

  /* This first pass over the saved markers discovers whether there are
   * any ICC markers and verifies the consistency of the marker numbering.
   */

  for (seq_no = 1; seq_no <= MAX_SEQ_NO; seq_no++)
    marker_present[seq_no] = 0;

  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      if (num_markers == 0)
        num_markers = marker->data[13];
      else if (num_markers != marker->data[13]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* inconsistent num_markers fields */
        return FALSE;
      }
      seq_no = marker->data[12];
      if (seq_no <= 0 || seq_no > num_markers) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* bogus sequence number */
        return FALSE;
      }
      if (marker_present[seq_no]) {
        WARNMS(cinfo, JWRN_BOGUS_ICC);  /* duplicate sequence numbers */
        return FALSE;
      }
      marker_present[seq_no] = 1;
      data_length[seq_no] = marker->data_length - ICC_OVERHEAD_LEN;
    }
  }

  if (num_markers == 0)
    return FALSE;

  /* Check for missing markers, count total space needed,
   * compute offset of each marker's part of the data.
   */

  total_length = 0;
  for (seq_no = 1; seq_no <= num_markers; seq_no++) {
    if (marker_present[seq_no] == 0) {
      WARNMS(cinfo, JWRN_BOGUS_ICC);  /* missing sequence number */
      return FALSE;
    }
    data_offset[seq_no] = total_length;
    total_length += data_length[seq_no];
  }

  if (total_length == 0) {
    WARNMS(cinfo, JWRN_BOGUS_ICC);  /* found only empty markers? */
    return FALSE;
  }

  /* Allocate space for assembled data */
  icc_data = (JOCTET *)malloc(total_length * sizeof(JOCTET));
  if (icc_data == NULL)
    ERREXIT1(cinfo, JERR_OUT_OF_MEMORY, 11);  /* oops, out of memory */

  /* and fill it in */
  for (marker = cinfo->marker_list; marker != NULL; marker = marker->next) {
    if (marker_is_icc(marker)) {
      JOCTET FAR *src_ptr;
      JOCTET *dst_ptr;
      unsigned int length;
      seq_no = marker->data[12];
      dst_ptr = icc_data + data_offset[seq_no];
      src_ptr = marker->data + ICC_OVERHEAD_LEN;
      length = data_length[seq_no];
      while (length--) {
        *dst_ptr++ = *src_ptr++;
      }
    }
  }

  *icc_data_ptr = icc_data;
  *icc_data_len = total_length;

  return TRUE;
}